

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void embree::avx::
     BVHNIntersector1<4,_16777232,_false,_embree::avx::ArrayIntersector1<embree::avx::TriangleMiMBIntersector1Moeller<4,_true>_>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  float *pfVar1;
  undefined8 *puVar2;
  float *pfVar3;
  undefined4 uVar4;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar5;
  Geometry *pGVar6;
  long lVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  AABBNodeMB4D *node1;
  ulong uVar27;
  uint uVar28;
  ulong uVar29;
  long lVar30;
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  ulong uVar35;
  ulong uVar36;
  ulong uVar37;
  ulong uVar38;
  long lVar39;
  ulong uVar40;
  ulong uVar41;
  ulong uVar42;
  float fVar43;
  float fVar50;
  float fVar51;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  float fVar52;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  float fVar65;
  float fVar78;
  float fVar79;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  float fVar80;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  float fVar81;
  float fVar89;
  float fVar90;
  float fVar91;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  float fVar92;
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [64];
  undefined1 auVar101 [16];
  undefined1 auVar102 [64];
  undefined1 auVar103 [64];
  undefined1 auVar104 [16];
  undefined1 auVar105 [64];
  float fVar106;
  float fVar108;
  uint uVar109;
  float fVar110;
  uint uVar111;
  float fVar112;
  uint uVar113;
  undefined1 auVar107 [64];
  float fVar114;
  float fVar116;
  float fVar117;
  float fVar118;
  undefined1 auVar115 [64];
  undefined1 auVar119 [16];
  undefined1 auVar120 [64];
  undefined1 auVar121 [16];
  undefined1 auVar122 [64];
  float fVar124;
  float fVar125;
  float fVar126;
  undefined1 auVar123 [64];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  Scene *scene;
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  NodeRef stack [244];
  undefined8 local_aa8;
  undefined8 uStack_aa0;
  int local_a7c;
  undefined1 local_a78 [16];
  undefined1 local_a68 [16];
  undefined1 local_a58 [8];
  float fStack_a50;
  float fStack_a4c;
  undefined1 local_a48 [8];
  float fStack_a40;
  float fStack_a3c;
  undefined1 local_a38 [16];
  Scene *local_a28;
  long local_a20;
  undefined1 local_a18 [8];
  float fStack_a10;
  float fStack_a0c;
  ulong local_a00;
  ulong *local_9f8;
  long local_9f0;
  ulong local_9e8;
  ulong local_9e0;
  undefined4 local_9d8;
  undefined4 local_9d4;
  undefined4 local_9d0;
  undefined4 local_9cc;
  float local_9c8;
  undefined4 local_9c4;
  uint local_9c0;
  uint local_9bc;
  uint local_9b8;
  RTCFilterFunctionNArguments local_9a8;
  undefined1 local_978 [16];
  undefined1 local_968 [16];
  undefined1 local_958 [16];
  undefined1 local_948 [16];
  undefined1 local_938 [16];
  undefined1 local_928 [16];
  undefined1 local_918 [16];
  undefined1 local_908 [16];
  undefined1 local_8f8 [16];
  undefined1 local_8e8 [8];
  float fStack_8e0;
  float fStack_8dc;
  undefined1 local_8d8 [8];
  float fStack_8d0;
  float fStack_8cc;
  undefined1 local_8c8 [8];
  float fStack_8c0;
  float fStack_8bc;
  undefined8 local_8b8;
  undefined8 uStack_8b0;
  undefined8 local_8a8;
  undefined8 uStack_8a0;
  undefined1 local_898 [16];
  undefined1 local_888 [16];
  undefined1 local_878 [16];
  undefined1 local_868 [16];
  undefined1 local_848 [16];
  undefined1 local_838 [16];
  undefined1 local_828 [16];
  float local_818 [4];
  undefined1 local_808 [16];
  undefined8 local_7f8;
  undefined8 uStack_7f0;
  undefined8 local_7e8;
  undefined8 uStack_7e0;
  ulong local_7d8;
  ulong local_7d0 [244];
  
  local_7d8 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_7d8 != 8) {
    fVar43 = ray->tfar;
    auVar100 = ZEXT1664(ZEXT816(0) << 0x40);
    if (0.0 <= fVar43) {
      local_9f8 = local_7d0;
      aVar5 = (ray->dir).field_0;
      auVar53 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      auVar45._8_4_ = 0x7fffffff;
      auVar45._0_8_ = 0x7fffffff7fffffff;
      auVar45._12_4_ = 0x7fffffff;
      auVar45 = vandps_avx((undefined1  [16])aVar5,auVar45);
      auVar93._8_4_ = 0x219392ef;
      auVar93._0_8_ = 0x219392ef219392ef;
      auVar93._12_4_ = 0x219392ef;
      auVar45 = vcmpps_avx(auVar45,auVar93,1);
      auVar45 = vblendvps_avx((undefined1  [16])aVar5,auVar93,auVar45);
      auVar93 = vrcpps_avx(auVar45);
      fVar50 = auVar93._0_4_;
      auVar66._0_4_ = fVar50 * auVar45._0_4_;
      fVar51 = auVar93._4_4_;
      auVar66._4_4_ = fVar51 * auVar45._4_4_;
      fVar52 = auVar93._8_4_;
      auVar66._8_4_ = fVar52 * auVar45._8_4_;
      fVar91 = auVar93._12_4_;
      auVar66._12_4_ = fVar91 * auVar45._12_4_;
      auVar94._8_4_ = 0x3f800000;
      auVar94._0_8_ = 0x3f8000003f800000;
      auVar94._12_4_ = 0x3f800000;
      auVar45 = vsubps_avx(auVar94,auVar66);
      auVar67._0_4_ = fVar50 + fVar50 * auVar45._0_4_;
      auVar67._4_4_ = fVar51 + fVar51 * auVar45._4_4_;
      auVar67._8_4_ = fVar52 + fVar52 * auVar45._8_4_;
      auVar67._12_4_ = fVar91 + fVar91 * auVar45._12_4_;
      uVar4 = *(undefined4 *)&(ray->org).field_0;
      local_8f8._4_4_ = uVar4;
      local_8f8._0_4_ = uVar4;
      local_8f8._8_4_ = uVar4;
      local_8f8._12_4_ = uVar4;
      auVar102 = ZEXT1664(local_8f8);
      uVar4 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
      local_908._4_4_ = uVar4;
      local_908._0_4_ = uVar4;
      local_908._8_4_ = uVar4;
      local_908._12_4_ = uVar4;
      auVar103 = ZEXT1664(local_908);
      uVar4 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
      local_918._4_4_ = uVar4;
      local_918._0_4_ = uVar4;
      local_918._8_4_ = uVar4;
      local_918._12_4_ = uVar4;
      auVar105 = ZEXT1664(local_918);
      local_928 = vshufps_avx(auVar67,auVar67,0);
      auVar107 = ZEXT1664(local_928);
      auVar45 = vmovshdup_avx(auVar67);
      local_938 = vshufps_avx(auVar67,auVar67,0x55);
      auVar115 = ZEXT1664(local_938);
      auVar93 = vshufpd_avx(auVar67,auVar67,1);
      local_948 = vshufps_avx(auVar67,auVar67,0xaa);
      auVar120 = ZEXT1664(local_948);
      uVar38 = (ulong)(auVar67._0_4_ < 0.0) << 4;
      uVar41 = (ulong)(auVar45._0_4_ < 0.0) << 4 | 0x20;
      uVar32 = (ulong)(auVar93._0_4_ < 0.0) << 4 | 0x40;
      local_958 = vshufps_avx(auVar53,auVar53,0);
      auVar122 = ZEXT1664(local_958);
      local_968 = vshufps_avx(ZEXT416((uint)fVar43),ZEXT416((uint)fVar43),0);
      auVar123 = ZEXT1664(local_968);
      local_978 = mm_lookupmask_ps._240_16_;
      local_a00 = uVar38;
      uVar31 = uVar38;
LAB_002c0cf3:
      do {
        uVar42 = local_9f8[-1];
        local_9f8 = local_9f8 + -1;
        while ((uVar42 & 8) == 0) {
          uVar27 = uVar42 & 0xfffffffffffffff0;
          fVar43 = (ray->dir).field_0.m128[3];
          auVar44._4_4_ = fVar43;
          auVar44._0_4_ = fVar43;
          auVar44._8_4_ = fVar43;
          auVar44._12_4_ = fVar43;
          pfVar3 = (float *)(uVar27 + 0x80 + uVar31);
          pfVar1 = (float *)(uVar27 + 0x20 + uVar31);
          auVar53._0_4_ = fVar43 * *pfVar3 + *pfVar1;
          auVar53._4_4_ = fVar43 * pfVar3[1] + pfVar1[1];
          auVar53._8_4_ = fVar43 * pfVar3[2] + pfVar1[2];
          auVar53._12_4_ = fVar43 * pfVar3[3] + pfVar1[3];
          auVar45 = vsubps_avx(auVar53,auVar102._0_16_);
          auVar54._0_4_ = auVar107._0_4_ * auVar45._0_4_;
          auVar54._4_4_ = auVar107._4_4_ * auVar45._4_4_;
          auVar54._8_4_ = auVar107._8_4_ * auVar45._8_4_;
          auVar54._12_4_ = auVar107._12_4_ * auVar45._12_4_;
          pfVar3 = (float *)(uVar27 + 0x80 + uVar41);
          auVar45 = vmaxps_avx(auVar122._0_16_,auVar54);
          pfVar1 = (float *)(uVar27 + 0x20 + uVar41);
          auVar68._0_4_ = fVar43 * *pfVar3 + *pfVar1;
          auVar68._4_4_ = fVar43 * pfVar3[1] + pfVar1[1];
          auVar68._8_4_ = fVar43 * pfVar3[2] + pfVar1[2];
          auVar68._12_4_ = fVar43 * pfVar3[3] + pfVar1[3];
          auVar53 = vsubps_avx(auVar68,auVar103._0_16_);
          pfVar3 = (float *)(uVar27 + 0x80 + uVar32);
          pfVar1 = (float *)(uVar27 + 0x20 + uVar32);
          auVar82._0_4_ = fVar43 * *pfVar3 + *pfVar1;
          auVar82._4_4_ = fVar43 * pfVar3[1] + pfVar1[1];
          auVar82._8_4_ = fVar43 * pfVar3[2] + pfVar1[2];
          auVar82._12_4_ = fVar43 * pfVar3[3] + pfVar1[3];
          auVar69._0_4_ = auVar115._0_4_ * auVar53._0_4_;
          auVar69._4_4_ = auVar115._4_4_ * auVar53._4_4_;
          auVar69._8_4_ = auVar115._8_4_ * auVar53._8_4_;
          auVar69._12_4_ = auVar115._12_4_ * auVar53._12_4_;
          auVar53 = vsubps_avx(auVar82,auVar105._0_16_);
          auVar83._0_4_ = auVar120._0_4_ * auVar53._0_4_;
          auVar83._4_4_ = auVar120._4_4_ * auVar53._4_4_;
          auVar83._8_4_ = auVar120._8_4_ * auVar53._8_4_;
          auVar83._12_4_ = auVar120._12_4_ * auVar53._12_4_;
          auVar53 = vmaxps_avx(auVar69,auVar83);
          pfVar3 = (float *)(uVar27 + 0x80 + (uVar38 ^ 0x10));
          pfVar1 = (float *)(uVar27 + 0x20 + (uVar38 ^ 0x10));
          auVar84._0_4_ = fVar43 * *pfVar3 + *pfVar1;
          auVar84._4_4_ = fVar43 * pfVar3[1] + pfVar1[1];
          auVar84._8_4_ = fVar43 * pfVar3[2] + pfVar1[2];
          auVar84._12_4_ = fVar43 * pfVar3[3] + pfVar1[3];
          auVar45 = vmaxps_avx(auVar45,auVar53);
          auVar53 = vsubps_avx(auVar84,auVar102._0_16_);
          auVar70._0_4_ = auVar107._0_4_ * auVar53._0_4_;
          auVar70._4_4_ = auVar107._4_4_ * auVar53._4_4_;
          auVar70._8_4_ = auVar107._8_4_ * auVar53._8_4_;
          auVar70._12_4_ = auVar107._12_4_ * auVar53._12_4_;
          auVar53 = vminps_avx(auVar123._0_16_,auVar70);
          pfVar3 = (float *)(uVar27 + 0x80 + (uVar41 ^ 0x10));
          pfVar1 = (float *)(uVar27 + 0x20 + (uVar41 ^ 0x10));
          auVar85._0_4_ = fVar43 * *pfVar3 + *pfVar1;
          auVar85._4_4_ = fVar43 * pfVar3[1] + pfVar1[1];
          auVar85._8_4_ = fVar43 * pfVar3[2] + pfVar1[2];
          auVar85._12_4_ = fVar43 * pfVar3[3] + pfVar1[3];
          auVar93 = vsubps_avx(auVar85,auVar103._0_16_);
          auVar86._0_4_ = auVar115._0_4_ * auVar93._0_4_;
          auVar86._4_4_ = auVar115._4_4_ * auVar93._4_4_;
          auVar86._8_4_ = auVar115._8_4_ * auVar93._8_4_;
          auVar86._12_4_ = auVar115._12_4_ * auVar93._12_4_;
          pfVar3 = (float *)(uVar27 + 0x80 + (uVar32 ^ 0x10));
          pfVar1 = (float *)(uVar27 + 0x20 + (uVar32 ^ 0x10));
          auVar95._0_4_ = fVar43 * *pfVar3 + *pfVar1;
          auVar95._4_4_ = fVar43 * pfVar3[1] + pfVar1[1];
          auVar95._8_4_ = fVar43 * pfVar3[2] + pfVar1[2];
          auVar95._12_4_ = fVar43 * pfVar3[3] + pfVar1[3];
          auVar93 = vsubps_avx(auVar95,auVar105._0_16_);
          auVar96._0_4_ = auVar120._0_4_ * auVar93._0_4_;
          auVar96._4_4_ = auVar120._4_4_ * auVar93._4_4_;
          auVar96._8_4_ = auVar120._8_4_ * auVar93._8_4_;
          auVar96._12_4_ = auVar120._12_4_ * auVar93._12_4_;
          auVar93 = vminps_avx(auVar86,auVar96);
          auVar53 = vminps_avx(auVar53,auVar93);
          if (((uint)uVar42 & 7) == 6) {
            auVar53 = vcmpps_avx(auVar45,auVar53,2);
            auVar45 = vcmpps_avx(*(undefined1 (*) [16])(uVar27 + 0xe0),auVar44,2);
            auVar93 = vcmpps_avx(auVar44,*(undefined1 (*) [16])(uVar27 + 0xf0),1);
            auVar45 = vandps_avx(auVar45,auVar93);
            auVar45 = vandps_avx(auVar45,auVar53);
          }
          else {
            auVar45 = vcmpps_avx(auVar45,auVar53,2);
          }
          auVar45 = vpslld_avx(auVar45,0x1f);
          uVar28 = vmovmskps_avx(auVar45);
          if (uVar28 == 0) {
            if (local_9f8 == &local_7d8) {
              return;
            }
            goto LAB_002c0cf3;
          }
          uVar28 = uVar28 & 0xff;
          lVar7 = 0;
          if (uVar28 != 0) {
            for (; (uVar28 >> lVar7 & 1) == 0; lVar7 = lVar7 + 1) {
            }
          }
          uVar42 = *(ulong *)(uVar27 + lVar7 * 8);
          uVar28 = uVar28 - 1 & uVar28;
          if (uVar28 != 0) {
            *local_9f8 = uVar42;
            local_9f8 = local_9f8 + 1;
            lVar7 = 0;
            if (uVar28 != 0) {
              for (; (uVar28 >> lVar7 & 1) == 0; lVar7 = lVar7 + 1) {
              }
            }
            uVar42 = *(ulong *)(uVar27 + lVar7 * 8);
            uVar28 = uVar28 - 1 & uVar28;
            uVar29 = (ulong)uVar28;
            if (uVar28 != 0) {
              do {
                *local_9f8 = uVar42;
                local_9f8 = local_9f8 + 1;
                lVar7 = 0;
                if (uVar29 != 0) {
                  for (; (uVar29 >> lVar7 & 1) == 0; lVar7 = lVar7 + 1) {
                  }
                }
                uVar42 = *(ulong *)(uVar27 + lVar7 * 8);
                uVar29 = uVar29 & uVar29 - 1;
              } while (uVar29 != 0);
            }
          }
        }
        local_9f0 = (ulong)((uint)uVar42 & 0xf) - 8;
        if (local_9f0 != 0) {
          uVar42 = uVar42 & 0xfffffffffffffff0;
          local_a28 = context->scene;
          local_a20 = 0;
          do {
            lVar39 = local_a20 * 0x50;
            pGVar6 = (local_a28->geometries).items[*(uint *)(uVar42 + 0x30 + lVar39)].ptr;
            fVar43 = (pGVar6->time_range).lower;
            fVar43 = pGVar6->fnumTimeSegments *
                     (((ray->dir).field_0.m128[3] - fVar43) / ((pGVar6->time_range).upper - fVar43))
            ;
            auVar45 = vroundss_avx(ZEXT416((uint)fVar43),ZEXT416((uint)fVar43),9);
            auVar45 = vminss_avx(auVar45,ZEXT416((uint)(pGVar6->fnumTimeSegments + -1.0)));
            auVar83 = vmaxss_avx(auVar100._0_16_,auVar45);
            lVar30 = (long)(int)auVar83._0_4_ * 0x38;
            uVar40 = (ulong)*(uint *)(uVar42 + 4 + lVar39);
            lVar7 = *(long *)(*(long *)&pGVar6[2].numPrimitives + lVar30);
            lVar30 = *(long *)(*(long *)&pGVar6[2].numPrimitives + 0x38 + lVar30);
            auVar45 = *(undefined1 (*) [16])(lVar7 + (ulong)*(uint *)(uVar42 + lVar39) * 4);
            uVar27 = (ulong)*(uint *)(uVar42 + 0x10 + lVar39);
            auVar53 = *(undefined1 (*) [16])(lVar7 + uVar27 * 4);
            uVar29 = (ulong)*(uint *)(uVar42 + 0x20 + lVar39);
            auVar85 = *(undefined1 (*) [16])(lVar7 + uVar29 * 4);
            auVar93 = *(undefined1 (*) [16])(lVar7 + uVar40 * 4);
            uVar33 = (ulong)*(uint *)(uVar42 + 0x14 + lVar39);
            auVar66 = *(undefined1 (*) [16])(lVar7 + uVar33 * 4);
            uVar34 = (ulong)*(uint *)(uVar42 + 0x24 + lVar39);
            auVar86 = *(undefined1 (*) [16])(lVar7 + uVar34 * 4);
            uVar35 = (ulong)*(uint *)(uVar42 + 8 + lVar39);
            auVar67 = *(undefined1 (*) [16])(lVar7 + uVar35 * 4);
            local_9e0 = (ulong)*(uint *)(uVar42 + 0x18 + lVar39);
            auVar94 = *(undefined1 (*) [16])(lVar7 + local_9e0 * 4);
            uVar36 = (ulong)*(uint *)(uVar42 + 0x28 + lVar39);
            auVar44 = *(undefined1 (*) [16])(lVar7 + uVar36 * 4);
            uVar37 = (ulong)*(uint *)(uVar42 + 0xc + lVar39);
            auVar54 = *(undefined1 (*) [16])(lVar7 + uVar37 * 4);
            local_9e8 = (ulong)*(uint *)(uVar42 + 0x1c + lVar39);
            auVar68 = *(undefined1 (*) [16])(lVar7 + local_9e8 * 4);
            uVar31 = (ulong)*(uint *)(uVar42 + 0x2c + lVar39);
            auVar69 = *(undefined1 (*) [16])(lVar7 + uVar31 * 4);
            auVar70 = *(undefined1 (*) [16])(lVar30 + (ulong)*(uint *)(uVar42 + lVar39) * 4);
            auVar82 = *(undefined1 (*) [16])(lVar30 + uVar27 * 4);
            fVar43 = fVar43 - auVar83._0_4_;
            auVar83 = vunpcklps_avx(auVar45,auVar67);
            auVar67 = vunpckhps_avx(auVar45,auVar67);
            auVar84 = vunpcklps_avx(auVar93,auVar54);
            auVar93 = vunpckhps_avx(auVar93,auVar54);
            auVar45 = *(undefined1 (*) [16])(lVar30 + uVar40 * 4);
            _local_8d8 = vunpcklps_avx(auVar67,auVar93);
            auVar25 = _local_8d8;
            auVar54 = vunpcklps_avx(auVar83,auVar84);
            auVar67 = vunpckhps_avx(auVar83,auVar84);
            auVar83 = vunpcklps_avx(auVar53,auVar94);
            auVar93 = vunpckhps_avx(auVar53,auVar94);
            auVar94 = vunpcklps_avx(auVar66,auVar68);
            auVar66 = vunpckhps_avx(auVar66,auVar68);
            auVar53 = *(undefined1 (*) [16])(lVar30 + uVar35 * 4);
            auVar68 = vunpcklps_avx(auVar93,auVar66);
            auVar84 = vunpcklps_avx(auVar83,auVar94);
            _local_8e8 = vunpckhps_avx(auVar83,auVar94);
            auVar24 = _local_8e8;
            auVar83 = vunpcklps_avx(auVar85,auVar44);
            auVar66 = vunpckhps_avx(auVar85,auVar44);
            auVar44 = vunpcklps_avx(auVar86,auVar69);
            auVar94 = vunpckhps_avx(auVar86,auVar69);
            auVar93 = *(undefined1 (*) [16])(lVar30 + uVar37 * 4);
            auVar69 = vunpcklps_avx(auVar66,auVar94);
            _local_8c8 = vunpcklps_avx(auVar83,auVar44);
            auVar26 = _local_8c8;
            _local_a18 = vunpckhps_avx(auVar83,auVar44);
            auVar23 = _local_a18;
            auVar66 = vunpcklps_avx(auVar70,auVar53);
            auVar53 = vunpckhps_avx(auVar70,auVar53);
            auVar94 = vunpcklps_avx(auVar45,auVar93);
            auVar93 = vunpckhps_avx(auVar45,auVar93);
            auVar45 = *(undefined1 (*) [16])(lVar30 + local_9e0 * 4);
            auVar44 = vunpcklps_avx(auVar53,auVar93);
            auVar70 = vunpcklps_avx(auVar66,auVar94);
            auVar93 = vunpckhps_avx(auVar66,auVar94);
            auVar94 = vunpcklps_avx(auVar82,auVar45);
            auVar66 = vunpckhps_avx(auVar82,auVar45);
            auVar45 = *(undefined1 (*) [16])(lVar30 + uVar33 * 4);
            auVar53 = *(undefined1 (*) [16])(lVar30 + local_9e8 * 4);
            auVar82 = vunpcklps_avx(auVar45,auVar53);
            auVar45 = vunpckhps_avx(auVar45,auVar53);
            auVar83 = vunpcklps_avx(auVar66,auVar45);
            auVar85 = vunpcklps_avx(auVar94,auVar82);
            auVar66 = vunpckhps_avx(auVar94,auVar82);
            auVar45 = *(undefined1 (*) [16])(lVar30 + uVar29 * 4);
            auVar53 = *(undefined1 (*) [16])(lVar30 + uVar36 * 4);
            auVar82 = vunpcklps_avx(auVar45,auVar53);
            auVar94 = vunpckhps_avx(auVar45,auVar53);
            auVar45 = *(undefined1 (*) [16])(lVar30 + uVar34 * 4);
            auVar53 = *(undefined1 (*) [16])(lVar30 + uVar31 * 4);
            auVar86 = vunpcklps_avx(auVar45,auVar53);
            auVar45 = vunpckhps_avx(auVar45,auVar53);
            auVar95 = vunpcklps_avx(auVar94,auVar45);
            auVar96 = vunpcklps_avx(auVar82,auVar86);
            auVar94 = vunpckhps_avx(auVar82,auVar86);
            auVar45 = vshufps_avx(ZEXT416((uint)fVar43),ZEXT416((uint)fVar43),0);
            auVar53 = vshufps_avx(ZEXT416((uint)(1.0 - fVar43)),ZEXT416((uint)(1.0 - fVar43)),0);
            fVar43 = auVar45._0_4_;
            fVar50 = auVar45._4_4_;
            fVar51 = auVar45._8_4_;
            fVar52 = auVar45._12_4_;
            fVar91 = auVar53._0_4_;
            fVar124 = auVar53._4_4_;
            fVar125 = auVar53._8_4_;
            fVar126 = auVar53._12_4_;
            auVar99._0_4_ = fVar91 * auVar54._0_4_ + fVar43 * auVar70._0_4_;
            auVar99._4_4_ = fVar124 * auVar54._4_4_ + fVar50 * auVar70._4_4_;
            auVar99._8_4_ = fVar125 * auVar54._8_4_ + fVar51 * auVar70._8_4_;
            auVar99._12_4_ = fVar126 * auVar54._12_4_ + fVar52 * auVar70._12_4_;
            auVar101._0_4_ = fVar91 * auVar67._0_4_ + fVar43 * auVar93._0_4_;
            auVar101._4_4_ = fVar124 * auVar67._4_4_ + fVar50 * auVar93._4_4_;
            auVar101._8_4_ = fVar125 * auVar67._8_4_ + fVar51 * auVar93._8_4_;
            auVar101._12_4_ = fVar126 * auVar67._12_4_ + fVar52 * auVar93._12_4_;
            auVar97._0_4_ = fVar91 * (float)local_8d8._0_4_ + fVar43 * auVar44._0_4_;
            auVar97._4_4_ = fVar124 * (float)local_8d8._4_4_ + fVar50 * auVar44._4_4_;
            auVar97._8_4_ = fVar125 * fStack_8d0 + fVar51 * auVar44._8_4_;
            auVar97._12_4_ = fVar126 * fStack_8cc + fVar52 * auVar44._12_4_;
            auVar55._0_4_ = fVar91 * auVar84._0_4_ + fVar43 * auVar85._0_4_;
            auVar55._4_4_ = fVar124 * auVar84._4_4_ + fVar50 * auVar85._4_4_;
            auVar55._8_4_ = fVar125 * auVar84._8_4_ + fVar51 * auVar85._8_4_;
            auVar55._12_4_ = fVar126 * auVar84._12_4_ + fVar52 * auVar85._12_4_;
            auVar71._0_4_ = fVar91 * (float)local_8e8._0_4_ + fVar43 * auVar66._0_4_;
            auVar71._4_4_ = fVar124 * (float)local_8e8._4_4_ + fVar50 * auVar66._4_4_;
            auVar71._8_4_ = fVar125 * fStack_8e0 + fVar51 * auVar66._8_4_;
            auVar71._12_4_ = fVar126 * fStack_8dc + fVar52 * auVar66._12_4_;
            puVar2 = (undefined8 *)(uVar42 + 0x30 + lVar39);
            local_8a8 = *puVar2;
            uStack_8a0 = puVar2[1];
            puVar2 = (undefined8 *)(uVar42 + 0x40 + lVar39);
            local_a48._0_4_ = auVar68._0_4_;
            local_a48._4_4_ = auVar68._4_4_;
            fStack_a40 = auVar68._8_4_;
            fStack_a3c = auVar68._12_4_;
            auVar104._0_4_ = fVar91 * (float)local_a48._0_4_ + auVar83._0_4_ * fVar43;
            auVar104._4_4_ = fVar124 * (float)local_a48._4_4_ + auVar83._4_4_ * fVar50;
            auVar104._8_4_ = fVar125 * fStack_a40 + auVar83._8_4_ * fVar51;
            auVar104._12_4_ = fVar126 * fStack_a3c + auVar83._12_4_ * fVar52;
            auVar119._0_4_ = fVar91 * (float)local_8c8._0_4_ + auVar96._0_4_ * fVar43;
            auVar119._4_4_ = fVar124 * (float)local_8c8._4_4_ + auVar96._4_4_ * fVar50;
            auVar119._8_4_ = fVar125 * fStack_8c0 + auVar96._8_4_ * fVar51;
            auVar119._12_4_ = fVar126 * fStack_8bc + auVar96._12_4_ * fVar52;
            auVar121._0_4_ = auVar94._0_4_ * fVar43 + fVar91 * (float)local_a18._0_4_;
            auVar121._4_4_ = auVar94._4_4_ * fVar50 + fVar124 * (float)local_a18._4_4_;
            auVar121._8_4_ = auVar94._8_4_ * fVar51 + fVar125 * fStack_a10;
            auVar121._12_4_ = auVar94._12_4_ * fVar52 + fVar126 * fStack_a0c;
            local_a58._0_4_ = auVar69._0_4_;
            local_a58._4_4_ = auVar69._4_4_;
            fStack_a50 = auVar69._8_4_;
            fStack_a4c = auVar69._12_4_;
            auVar46._0_4_ = fVar91 * (float)local_a58._0_4_ + auVar95._0_4_ * fVar43;
            auVar46._4_4_ = fVar124 * (float)local_a58._4_4_ + auVar95._4_4_ * fVar50;
            auVar46._8_4_ = fVar125 * fStack_a50 + auVar95._8_4_ * fVar51;
            auVar46._12_4_ = fVar126 * fStack_a4c + auVar95._12_4_ * fVar52;
            local_8b8 = *puVar2;
            uStack_8b0 = puVar2[1];
            auVar45 = vsubps_avx(auVar99,auVar55);
            auVar53 = vsubps_avx(auVar101,auVar71);
            auVar93 = vsubps_avx(auVar97,auVar104);
            auVar66 = vsubps_avx(auVar119,auVar99);
            auVar67 = vsubps_avx(auVar121,auVar101);
            auVar94 = vsubps_avx(auVar46,auVar97);
            fVar52 = auVar94._0_4_;
            fVar106 = auVar53._0_4_;
            auVar47._0_4_ = fVar106 * fVar52;
            fVar8 = auVar94._4_4_;
            fVar108 = auVar53._4_4_;
            auVar47._4_4_ = fVar108 * fVar8;
            fVar13 = auVar94._8_4_;
            fVar110 = auVar53._8_4_;
            auVar47._8_4_ = fVar110 * fVar13;
            fVar18 = auVar94._12_4_;
            fVar112 = auVar53._12_4_;
            auVar47._12_4_ = fVar112 * fVar18;
            fVar91 = auVar67._0_4_;
            fVar114 = auVar93._0_4_;
            auVar56._0_4_ = fVar114 * fVar91;
            fVar9 = auVar67._4_4_;
            fVar116 = auVar93._4_4_;
            auVar56._4_4_ = fVar116 * fVar9;
            fVar14 = auVar67._8_4_;
            fVar117 = auVar93._8_4_;
            auVar56._8_4_ = fVar117 * fVar14;
            fVar19 = auVar67._12_4_;
            fVar118 = auVar93._12_4_;
            auVar56._12_4_ = fVar118 * fVar19;
            local_a68 = vsubps_avx(auVar56,auVar47);
            fVar124 = auVar66._0_4_;
            auVar57._0_4_ = fVar114 * fVar124;
            fVar10 = auVar66._4_4_;
            auVar57._4_4_ = fVar116 * fVar10;
            fVar15 = auVar66._8_4_;
            auVar57._8_4_ = fVar117 * fVar15;
            fVar20 = auVar66._12_4_;
            auVar57._12_4_ = fVar118 * fVar20;
            fVar125 = auVar45._0_4_;
            auVar72._0_4_ = fVar52 * fVar125;
            fVar11 = auVar45._4_4_;
            auVar72._4_4_ = fVar8 * fVar11;
            fVar16 = auVar45._8_4_;
            auVar72._8_4_ = fVar13 * fVar16;
            fVar21 = auVar45._12_4_;
            auVar72._12_4_ = fVar18 * fVar21;
            auVar93 = vsubps_avx(auVar72,auVar57);
            auVar73._0_4_ = fVar91 * fVar125;
            auVar73._4_4_ = fVar9 * fVar11;
            auVar73._8_4_ = fVar14 * fVar16;
            auVar73._12_4_ = fVar19 * fVar21;
            auVar87._0_4_ = fVar106 * fVar124;
            auVar87._4_4_ = fVar108 * fVar10;
            auVar87._8_4_ = fVar110 * fVar15;
            auVar87._12_4_ = fVar112 * fVar20;
            local_a78 = vsubps_avx(auVar87,auVar73);
            uVar4 = *(undefined4 *)&(ray->org).field_0;
            auVar88._4_4_ = uVar4;
            auVar88._0_4_ = uVar4;
            auVar88._8_4_ = uVar4;
            auVar88._12_4_ = uVar4;
            uVar4 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
            auVar48._4_4_ = uVar4;
            auVar48._0_4_ = uVar4;
            auVar48._8_4_ = uVar4;
            auVar48._12_4_ = uVar4;
            uVar4 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
            auVar127._4_4_ = uVar4;
            auVar127._0_4_ = uVar4;
            auVar127._8_4_ = uVar4;
            auVar127._12_4_ = uVar4;
            fVar43 = (ray->dir).field_0.m128[1];
            local_a38 = vsubps_avx(auVar99,auVar88);
            fVar50 = (ray->dir).field_0.m128[2];
            _local_a48 = vsubps_avx(auVar101,auVar48);
            _local_a58 = vsubps_avx(auVar97,auVar127);
            fVar126 = local_a58._0_4_;
            auVar98._0_4_ = fVar43 * fVar126;
            fVar12 = local_a58._4_4_;
            auVar98._4_4_ = fVar43 * fVar12;
            fVar17 = local_a58._8_4_;
            auVar98._8_4_ = fVar43 * fVar17;
            fVar22 = local_a58._12_4_;
            auVar98._12_4_ = fVar43 * fVar22;
            fVar81 = local_a48._0_4_;
            auVar128._0_4_ = fVar81 * fVar50;
            fVar89 = local_a48._4_4_;
            auVar128._4_4_ = fVar89 * fVar50;
            fVar90 = local_a48._8_4_;
            auVar128._8_4_ = fVar90 * fVar50;
            fVar92 = local_a48._12_4_;
            auVar128._12_4_ = fVar92 * fVar50;
            auVar53 = vsubps_avx(auVar128,auVar98);
            fVar51 = (ray->dir).field_0.m128[0];
            fVar65 = local_a38._0_4_;
            auVar49._0_4_ = fVar65 * fVar50;
            fVar78 = local_a38._4_4_;
            auVar49._4_4_ = fVar78 * fVar50;
            fVar79 = local_a38._8_4_;
            auVar49._8_4_ = fVar79 * fVar50;
            fVar80 = local_a38._12_4_;
            auVar49._12_4_ = fVar80 * fVar50;
            auVar58._0_4_ = fVar126 * fVar51;
            auVar58._4_4_ = fVar12 * fVar51;
            auVar58._8_4_ = fVar17 * fVar51;
            auVar58._12_4_ = fVar22 * fVar51;
            auVar66 = vsubps_avx(auVar58,auVar49);
            auVar59._0_4_ = fVar81 * fVar51;
            auVar59._4_4_ = fVar89 * fVar51;
            auVar59._8_4_ = fVar90 * fVar51;
            auVar59._12_4_ = fVar92 * fVar51;
            auVar74._0_4_ = fVar43 * fVar65;
            auVar74._4_4_ = fVar43 * fVar78;
            auVar74._8_4_ = fVar43 * fVar79;
            auVar74._12_4_ = fVar43 * fVar80;
            auVar67 = vsubps_avx(auVar74,auVar59);
            auVar94 = local_a78;
            auVar75._0_4_ =
                 local_a68._0_4_ * fVar51 + fVar43 * auVar93._0_4_ + local_a78._0_4_ * fVar50;
            auVar75._4_4_ =
                 local_a68._4_4_ * fVar51 + fVar43 * auVar93._4_4_ + local_a78._4_4_ * fVar50;
            auVar75._8_4_ =
                 local_a68._8_4_ * fVar51 + fVar43 * auVar93._8_4_ + local_a78._8_4_ * fVar50;
            auVar75._12_4_ =
                 local_a68._12_4_ * fVar51 + fVar43 * auVar93._12_4_ + local_a78._12_4_ * fVar50;
            auVar60._8_8_ = 0x8000000080000000;
            auVar60._0_8_ = 0x8000000080000000;
            auVar45 = vandps_avx(auVar75,auVar60);
            uVar28 = auVar45._0_4_;
            local_898._0_4_ =
                 (float)(uVar28 ^ (uint)(fVar124 * auVar53._0_4_ +
                                        fVar91 * auVar66._0_4_ + fVar52 * auVar67._0_4_));
            uVar109 = auVar45._4_4_;
            local_898._4_4_ =
                 (float)(uVar109 ^
                        (uint)(fVar10 * auVar53._4_4_ +
                              fVar9 * auVar66._4_4_ + fVar8 * auVar67._4_4_));
            uVar111 = auVar45._8_4_;
            local_898._8_4_ =
                 (float)(uVar111 ^
                        (uint)(fVar15 * auVar53._8_4_ +
                              fVar14 * auVar66._8_4_ + fVar13 * auVar67._8_4_));
            uVar113 = auVar45._12_4_;
            local_898._12_4_ =
                 (float)(uVar113 ^
                        (uint)(fVar20 * auVar53._12_4_ +
                              fVar19 * auVar66._12_4_ + fVar18 * auVar67._12_4_));
            local_888._0_4_ =
                 (float)(uVar28 ^ (uint)(auVar53._0_4_ * fVar125 +
                                        fVar106 * auVar66._0_4_ + fVar114 * auVar67._0_4_));
            local_888._4_4_ =
                 (float)(uVar109 ^
                        (uint)(auVar53._4_4_ * fVar11 +
                              fVar108 * auVar66._4_4_ + fVar116 * auVar67._4_4_));
            local_888._8_4_ =
                 (float)(uVar111 ^
                        (uint)(auVar53._8_4_ * fVar16 +
                              fVar110 * auVar66._8_4_ + fVar117 * auVar67._8_4_));
            local_888._12_4_ =
                 (float)(uVar113 ^
                        (uint)(auVar53._12_4_ * fVar21 +
                              fVar112 * auVar66._12_4_ + fVar118 * auVar67._12_4_));
            auVar66 = ZEXT816(0) << 0x20;
            auVar45 = vcmpps_avx(local_898,auVar66,5);
            auVar53 = vcmpps_avx(local_888,auVar66,5);
            auVar45 = vandps_avx(auVar45,auVar53);
            auVar61._8_4_ = 0x7fffffff;
            auVar61._0_8_ = 0x7fffffff7fffffff;
            auVar61._12_4_ = 0x7fffffff;
            local_868 = vandps_avx(auVar75,auVar61);
            auVar53 = vcmpps_avx(auVar66,auVar75,4);
            auVar45 = vandps_avx(auVar45,auVar53);
            auVar62._0_4_ = local_898._0_4_ + local_888._0_4_;
            auVar62._4_4_ = local_898._4_4_ + local_888._4_4_;
            auVar62._8_4_ = local_898._8_4_ + local_888._8_4_;
            auVar62._12_4_ = local_898._12_4_ + local_888._12_4_;
            auVar53 = vcmpps_avx(auVar62,local_868,2);
            auVar45 = vandps_avx(auVar45,auVar53);
            auVar53 = local_978 & auVar45;
            if ((((auVar53 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar53 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar53 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar53[0xf] < '\0') {
              auVar45 = vandps_avx(auVar45,local_978);
              local_878._0_4_ =
                   (float)(uVar28 ^ (uint)(local_a68._0_4_ * fVar65 +
                                          fVar81 * auVar93._0_4_ + fVar126 * local_a78._0_4_));
              local_878._4_4_ =
                   (float)(uVar109 ^
                          (uint)(local_a68._4_4_ * fVar78 +
                                fVar89 * auVar93._4_4_ + fVar12 * local_a78._4_4_));
              local_878._8_4_ =
                   (float)(uVar111 ^
                          (uint)(local_a68._8_4_ * fVar79 +
                                fVar90 * auVar93._8_4_ + fVar17 * local_a78._8_4_));
              local_878._12_4_ =
                   (float)(uVar113 ^
                          (uint)(local_a68._12_4_ * fVar80 +
                                fVar92 * auVar93._12_4_ + fVar22 * local_a78._12_4_));
              fVar43 = (ray->org).field_0.m128[3];
              fVar50 = local_868._0_4_;
              auVar63._0_4_ = fVar50 * fVar43;
              fVar51 = local_868._4_4_;
              auVar63._4_4_ = fVar51 * fVar43;
              fVar52 = local_868._8_4_;
              auVar63._8_4_ = fVar52 * fVar43;
              fVar91 = local_868._12_4_;
              auVar63._12_4_ = fVar91 * fVar43;
              auVar53 = vcmpps_avx(auVar63,local_878,1);
              fVar43 = ray->tfar;
              auVar76._0_4_ = fVar50 * fVar43;
              auVar76._4_4_ = fVar51 * fVar43;
              auVar76._8_4_ = fVar52 * fVar43;
              auVar76._12_4_ = fVar91 * fVar43;
              auVar66 = vcmpps_avx(local_878,auVar76,2);
              auVar53 = vandps_avx(auVar66,auVar53);
              local_848 = vandps_avx(auVar53,auVar45);
              uVar28 = vmovmskps_avx(local_848);
              if (uVar28 != 0) {
                local_808 = local_a68;
                local_aa8 = auVar93._0_8_;
                uStack_aa0 = auVar93._8_8_;
                local_7f8 = local_aa8;
                uStack_7f0 = uStack_aa0;
                local_7e8 = local_a78._0_8_;
                uStack_7e0 = local_a78._8_8_;
                auVar45 = vrcpps_avx(local_868);
                fVar43 = auVar45._0_4_;
                auVar64._0_4_ = fVar50 * fVar43;
                fVar50 = auVar45._4_4_;
                auVar64._4_4_ = fVar51 * fVar50;
                fVar51 = auVar45._8_4_;
                auVar64._8_4_ = fVar52 * fVar51;
                fVar52 = auVar45._12_4_;
                auVar64._12_4_ = fVar91 * fVar52;
                auVar77._8_4_ = 0x3f800000;
                auVar77._0_8_ = 0x3f8000003f800000;
                auVar77._12_4_ = 0x3f800000;
                auVar45 = vsubps_avx(auVar77,auVar64);
                fVar43 = fVar43 + fVar43 * auVar45._0_4_;
                fVar50 = fVar50 + fVar50 * auVar45._4_4_;
                fVar51 = fVar51 + fVar51 * auVar45._8_4_;
                fVar52 = fVar52 + fVar52 * auVar45._12_4_;
                local_818[0] = fVar43 * local_878._0_4_;
                local_818[1] = fVar50 * local_878._4_4_;
                local_818[2] = fVar51 * local_878._8_4_;
                local_818[3] = fVar52 * local_878._12_4_;
                local_838._0_4_ = fVar43 * local_898._0_4_;
                local_838._4_4_ = fVar50 * local_898._4_4_;
                local_838._8_4_ = fVar51 * local_898._8_4_;
                local_838._12_4_ = fVar52 * local_898._12_4_;
                local_828._0_4_ = fVar43 * local_888._0_4_;
                local_828._4_4_ = fVar50 * local_888._4_4_;
                local_828._8_4_ = fVar51 * local_888._8_4_;
                local_828._12_4_ = fVar52 * local_888._12_4_;
                uVar31 = (ulong)(uVar28 & 0xff);
                local_a78 = auVar94;
                _local_a18 = auVar23;
                _local_8e8 = auVar24;
                _local_8d8 = auVar25;
                _local_8c8 = auVar26;
                do {
                  uVar27 = 0;
                  if (uVar31 != 0) {
                    for (; (uVar31 >> uVar27 & 1) == 0; uVar27 = uVar27 + 1) {
                    }
                  }
                  local_9c0 = *(uint *)((long)&local_8a8 + uVar27 * 4);
                  pGVar6 = (local_a28->geometries).items[local_9c0].ptr;
                  if ((pGVar6->mask & ray->mask) != 0) {
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar6->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_002c1709:
                      ray->tfar = -INFINITY;
                      return;
                    }
                    local_a68._0_8_ = context->args;
                    local_9a8.context = context->user;
                    local_9d8 = *(undefined4 *)(local_808 + uVar27 * 4);
                    local_9d4 = *(undefined4 *)((long)&local_7f8 + uVar27 * 4);
                    local_9d0 = *(undefined4 *)((long)&local_7e8 + uVar27 * 4);
                    local_9cc = *(undefined4 *)(local_838 + uVar27 * 4);
                    local_9c8 = local_818[uVar27 - 4];
                    local_9c4 = *(undefined4 *)((long)&local_8b8 + uVar27 * 4);
                    local_9bc = (local_9a8.context)->instID[0];
                    local_9b8 = (local_9a8.context)->instPrimID[0];
                    local_a38._0_4_ = ray->tfar;
                    local_a78._0_8_ = uVar27;
                    ray->tfar = local_818[uVar27];
                    local_a7c = -1;
                    local_9a8.valid = &local_a7c;
                    local_9a8.geometryUserPtr = pGVar6->userPtr;
                    local_9a8.hit = (RTCHitN *)&local_9d8;
                    local_9a8.N = 1;
                    local_a48 = (undefined1  [8])pGVar6;
                    local_9a8.ray = (RTCRayN *)ray;
                    if ((pGVar6->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
                       ((*pGVar6->occlusionFilterN)(&local_9a8), *local_9a8.valid != 0)) {
                      if ((*(code **)(local_a68._0_8_ + 0x10) == (code *)0x0) ||
                         ((((*(byte *)local_a68._0_8_ & 2) == 0 &&
                           ((*(byte *)((long)local_a48 + 0x3e) & 0x40) == 0)) ||
                          ((**(code **)(local_a68._0_8_ + 0x10))(&local_9a8), *local_9a8.valid != 0)
                          ))) goto LAB_002c1709;
                    }
                    ray->tfar = (float)local_a38._0_4_;
                    uVar27 = local_a78._0_8_;
                  }
                  uVar31 = uVar31 ^ 1L << (uVar27 & 0x3f);
                } while (uVar31 != 0);
              }
            }
            local_a20 = local_a20 + 1;
            auVar100 = ZEXT1664(ZEXT816(0) << 0x40);
          } while (local_a20 != local_9f0);
        }
        auVar102 = ZEXT1664(local_8f8);
        auVar103 = ZEXT1664(local_908);
        auVar105 = ZEXT1664(local_918);
        auVar107 = ZEXT1664(local_928);
        auVar115 = ZEXT1664(local_938);
        auVar120 = ZEXT1664(local_948);
        auVar122 = ZEXT1664(local_958);
        auVar123 = ZEXT1664(local_968);
        uVar31 = local_a00;
      } while (local_9f8 != &local_7d8);
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }